

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O0

void __thiscall EntitiesFixture::EntitiesFixture(EntitiesFixture *this)

{
  ComponentHandle<Direction,_entityx::EntityManager> CVar1;
  ComponentHandle<Counter,_entityx::EntityManager> CVar2;
  Entity e;
  int i;
  Id in_stack_ffffffffffffff38;
  EntityManager *in_stack_ffffffffffffff40;
  Id in_stack_ffffffffffffff48;
  EntityManager *in_stack_ffffffffffffff50;
  EntityX *in_stack_ffffffffffffff60;
  undefined4 local_c;
  
  entityx::EntityX::EntityX(in_stack_ffffffffffffff60);
  Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::vector
            ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)0x304a67);
  CVar1.id_.id_ = in_stack_ffffffffffffff48.id_;
  CVar1.manager_ = in_stack_ffffffffffffff50;
  CVar2.id_.id_ = in_stack_ffffffffffffff38.id_;
  CVar2.manager_ = in_stack_ffffffffffffff40;
  for (local_c = 0; local_c < 0x96; local_c = local_c + 1) {
    entityx::EntityManager::create(CVar1.manager_);
    Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::push_back
              ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)CVar1.manager_,
               (value_type *)CVar1.id_.id_.id_);
    if (local_c % 2 == 0) {
      entityx::Entity::assign<Position,int,int>
                ((Entity *)CVar1.manager_,(int *)CVar1.id_.id_.id_,(int *)CVar2.manager_);
    }
    if (local_c % 3 == 0) {
      CVar1 = entityx::Entity::assign<Direction,int,int>
                        ((Entity *)CVar1.manager_,(int *)CVar1.id_.id_.id_,(int *)CVar2.manager_);
    }
    CVar2 = entityx::Entity::assign<Counter,int>((Entity *)CVar2.manager_,(int *)CVar2.id_.id_.id_);
  }
  return;
}

Assistant:

EntitiesFixture() {
    for (int i = 0; i < 150; ++i) {
      Entity e = entities.create();
      created_entities.push_back(e);
      if (i % 2 == 0) e.assign<Position>(1, 2);
      if (i % 3 == 0) e.assign<Direction>(1, 1);

      e.assign<Counter>(0);
    }
  }